

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemUtils.h
# Opt level: O0

bool __thiscall FileSystemUtils::Path::Remove(Path *this)

{
  int iVar1;
  char *__filename;
  int error;
  Path *this_local;
  
  __filename = c_str(this);
  iVar1 = remove(__filename);
  return iVar1 == 0;
}

Assistant:

inline bool		Path::Remove()			const
	{
#ifdef _WIN32
		std::wstring temp = _Win32Utf8ToUtf16( m_string );
		int error = _wremove( temp.c_str() );
#else
		int error = remove( c_str() );
#endif
		if( !error )
		{
			return true;
		}
		return false;
	}